

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::
     Serialization<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>::
     save(BinaryBuffer *bb,Vector *v)

{
  size_type sVar1;
  const_reference bb_00;
  vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *in_RSI;
  Point<float,_3U> *in_RDI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffd8;
  BinaryBuffer *in_stack_ffffffffffffffe0;
  
  sVar1 = std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::size(in_RSI);
  save<unsigned_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (sVar1 != 0) {
    bb_00 = std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::operator[]
                      (in_RSI,0);
    std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::size(in_RSI);
    save<diy::Point<float,3u>>((BinaryBuffer *)bb_00,in_RDI,0x182e1b);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }